

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor_math.hpp
# Opt level: O0

taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> *
operator/(taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> *__return_storage_ptr__,int *x,
         taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> *t)

{
  taylor<taylor<double,_1,_2>,_1,_2> *a;
  undefined1 local_f0 [8];
  taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> tmp;
  taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> *t_local;
  int *x_local;
  
  tmp.super_polynomial<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2>.c[2].
  super_polynomial<taylor<double,_1,_2>,_1,_2>.c[2].super_polynomial<double,_1,_2>.c[2] = (double)t;
  taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2>::taylor
            ((taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> *)local_f0);
  a = taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2>::operator[]
                ((taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> *)
                 tmp.super_polynomial<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2>.c[2].
                 super_polynomial<taylor<double,_1,_2>,_1,_2>.c[2].super_polynomial<double,_1,_2>.c
                 [2],0);
  inv_taylor<taylor<taylor<double,1,2>,1,2>,2>
            ((taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> *)local_f0,a);
  taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2>::operator*=
            ((taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> *)local_f0,*x);
  taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2>::taylor(__return_storage_ptr__);
  taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2>::compose<2>
            ((taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> *)
             tmp.super_polynomial<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2>.c[2].
             super_polynomial<taylor<double,_1,_2>,_1,_2>.c[2].super_polynomial<double,_1,_2>.c[2],
             __return_storage_ptr__,(taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> *)local_f0);
  return __return_storage_ptr__;
}

Assistant:

static taylor<T, Nvar, Ndeg> operator/(const S & x,
                                       const taylor<T, Nvar, Ndeg> & t) {
#ifdef TAYLOR_LOGGING
  if (taylor_logging)
    cout << "operator/ S templated. x = " << x << endl;
#endif
  taylor<T, 1, Ndeg> tmp;
  inv_taylor(tmp, t[0]);
  tmp *= x;
  taylor<T, Nvar, Ndeg> res;
  t.compose(res, tmp);
  return res;
}